

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O1

Parsekey __thiscall
free_format_parser::HMpsFF::parseRhs(HMpsFF *this,HighsLogOptions *log_options,istream *file)

{
  ulong *puVar1;
  Boundtype BVar2;
  double dVar3;
  bool bVar4;
  Parsekey PVar5;
  int iVar6;
  long lVar7;
  iterator iVar8;
  size_t sVar9;
  pointer piVar10;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  _Var11;
  HighsInt id;
  ulong uVar12;
  char *pcVar13;
  HMpsFF *pHVar14;
  bool bVar15;
  char cVar16;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  bool skip;
  size_t end;
  string marker;
  string word;
  bool is_nan;
  size_t begin;
  string strline;
  Parsekey local_118;
  bool local_111;
  HighsLogOptions *local_110;
  pointer local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  HMpsFF *local_e0;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  vector<bool,_std::allocator<bool>_> *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  undefined1 local_80 [16];
  pointer local_70;
  undefined1 local_68 [16];
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  pHVar14 = (HMpsFF *)&this->has_row_entry_;
  local_110 = log_options;
  local_98 = (vector<bool,_std::allocator<bool>_> *)pHVar14;
  std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
            ((vector<bool,_std::allocator<bool>_> *)pHVar14,(long)this->num_row,false);
  this->has_obj_entry_ = false;
  local_e0 = (HMpsFF *)&this->rowname2idx;
  local_f8 = 1;
  local_f0 = 0;
  local_100 = 1;
  local_e8 = 0;
  while( true ) {
    do {
      bVar4 = getMpsLine(pHVar14,file,&local_50,&local_111);
      if (!bVar4) {
        local_118 = kFail;
        goto LAB_001f9b10;
      }
    } while (local_111 != false);
    if ((0.0 < this->time_limit_) &&
       (lVar7 = std::chrono::_V2::system_clock::now(),
       dVar3 = (double)lVar7 / 1000000000.0 - this->start_time,
       this->time_limit_ <= dVar3 && dVar3 != this->time_limit_)) break;
    local_70 = (pointer)0x0;
    local_108 = (pointer)0x0;
    local_b8._8_8_ = (char *)0x0;
    local_b8[0x10] = '\0';
    local_b8._0_8_ = (HMpsFF *)(local_b8 + 0x10);
    PVar5 = checkFirstWord(this,&local_50,(size_t *)&local_70,(size_t *)&local_108,
                           (string *)local_b8);
    if (PVar5 == kRhs) {
LAB_001f93b2:
      piVar10 = local_108;
      first_word((string *)local_d8,&local_50,(size_t)local_108);
      sVar9 = first_word_end(&local_50,(size_t)piVar10);
      id = 0x3d2f67;
      std::__cxx11::string::_M_replace((ulong)local_b8,0,(char *)local_b8._8_8_,0x3d2f67);
      first_word((string *)&local_90,&local_50,sVar9);
      std::__cxx11::string::operator=((string *)local_b8,(string *)local_90._M_local_buf);
      if ((undefined1 *)CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) !=
          local_80) {
        operator_delete((undefined1 *)
                        CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]));
      }
      piVar10 = (pointer)first_word_end(&local_50,sVar9);
      local_108 = piVar10;
      iVar6 = std::__cxx11::string::compare(local_b8);
      if (iVar6 == 0) {
        trim((string *)local_d8,&default_non_chars_abi_cxx11_);
        highsLogUser(local_110,kError,"No bound given for row \"%s\"\n",local_d8._0_8_);
LAB_001f9632:
        local_118 = kFail;
        bVar15 = true;
      }
      else {
        pHVar14 = local_e0;
        _Var11._M_cur =
             (__node_type *)
             std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_e0,(key_type *)local_d8);
        if (((_Var11._M_cur == (__node_type *)0x0) &&
            (local_d8._8_8_ == (this->mps_name)._M_string_length)) &&
           ((local_d8._8_8_ == 0 ||
            (pHVar14 = (HMpsFF *)local_d8._0_8_,
            iVar6 = bcmp((void *)local_d8._0_8_,(this->mps_name)._M_dataplus._M_p,local_d8._8_8_),
            iVar6 == 0)))) {
          std::__cxx11::string::_M_assign((string *)local_d8);
          id = 0x3d2f67;
          std::__cxx11::string::_M_replace((ulong)local_b8,0,(char *)local_b8._8_8_,0x3d2f67);
          first_word((string *)&local_90,&local_50,(size_t)piVar10);
          std::__cxx11::string::operator=((string *)local_b8,(string *)local_90._M_local_buf);
          if ((undefined1 *)CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0])
              != local_80) {
            operator_delete((undefined1 *)
                            CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]))
            ;
          }
          local_108 = (pointer)first_word_end(&local_50,(size_t)piVar10);
          iVar6 = std::__cxx11::string::compare(local_b8);
          if (iVar6 == 0) {
            trim((string *)local_d8,&default_non_chars_abi_cxx11_);
            highsLogUser(local_110,kError,"No bound given for SIF row \"%s\"\n",local_d8._0_8_);
            goto LAB_001f9632;
          }
          pHVar14 = local_e0;
          _Var11._M_cur =
               (__node_type *)
               std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_e0,(key_type *)local_d8);
        }
        if (_Var11._M_cur == (__node_type *)0x0) {
          local_e8 = local_e8 + 1;
          if (local_e8 % local_f8 == 0) {
            highsLogUser(local_110,kWarning,
                         "Row name \"%s\" in RHS section is not defined: ignored\n",local_d8._0_8_);
            local_f8 = local_f8 * 2;
          }
LAB_001f97ba:
          piVar10 = local_108;
          bVar4 = is_end(&local_50,(size_t)local_108,&default_non_chars_abi_cxx11_);
          bVar15 = false;
          if (!bVar4) {
            first_word((string *)&local_90,&local_50,(size_t)piVar10);
            std::__cxx11::string::operator=((string *)local_d8,(string *)local_90._M_local_buf);
            if ((undefined1 *)
                CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) != local_80)
            {
              operator_delete((undefined1 *)
                              CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]
                                      ));
            }
            iVar6 = std::__cxx11::string::compare(local_b8);
            if (iVar6 == 0) {
              trim((string *)local_d8,&default_non_chars_abi_cxx11_);
              highsLogUser(local_110,kError,"No coefficient given for rhs of row \"%s\"\n",
                           local_d8._0_8_);
              goto LAB_001f9632;
            }
            sVar9 = first_word_end(&local_50,(size_t)piVar10);
            pcVar13 = "";
            std::__cxx11::string::_M_replace((ulong)local_b8,0,(char *)local_b8._8_8_,0x3d2f67);
            first_word((string *)&local_90,&local_50,sVar9 + 1);
            std::__cxx11::string::operator=((string *)local_b8,(string *)local_90._M_local_buf);
            if ((undefined1 *)
                CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) != local_80)
            {
              operator_delete((undefined1 *)
                              CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]
                                      ));
            }
            local_108 = (pointer)first_word_end(&local_50,sVar9 + 1);
            iVar8 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            *)local_e0,(key_type *)local_d8);
            if (iVar8.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                ._M_cur == (__node_type *)0x0) {
              local_e8 = local_e8 + 1;
              bVar15 = false;
              if (local_e8 % local_f8 == 0) {
                highsLogUser(local_110,kWarning,
                             "Row name \"%s\" in RHS section is not defined: ignored\n",
                             local_d8._0_8_);
                local_f8 = local_f8 * 2;
              }
            }
            else {
              pHVar14 = local_e0;
              iVar8 = std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              *)local_e0,(key_type *)local_d8);
              iVar6 = *(int *)((long)iVar8.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                     ._M_cur + 0x28);
              uVar12 = (ulong)iVar6;
              if ((long)uVar12 < 0) {
                cVar16 = this->has_obj_entry_;
              }
              else {
                pcVar13 = (char *)(uVar12 >> 6);
                cVar16 = ((local_98->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                          [(long)pcVar13] >> (uVar12 & 0x3f) & 1) != 0;
              }
              local_90._M_local_buf[0] = '\0';
              dVar3 = getValue(pHVar14,(string *)local_b8,(bool *)local_90._M_local_buf,
                               (HighsInt)pcVar13);
              if (cVar16 == '\0') {
                if (local_90._M_local_buf[0] == '\x01') {
                  highsLogUser(local_110,kError,"RHS for row \"%s\" is NaN\n",local_d8._0_8_);
                  goto LAB_001f9632;
                }
                if (iVar6 < 0) {
                  this->obj_offset = -dVar3;
                  this->has_obj_entry_ = true;
                }
                else {
                  BVar2 = (this->row_type).
                          super__Vector_base<free_format_parser::HMpsFF::Boundtype,_std::allocator<free_format_parser::HMpsFF::Boundtype>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar12];
                  if (BVar2 < kGe) {
                    (this->row_upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar12] = dVar3;
                  }
                  if (BVar2 - kEq < 2) {
                    (this->row_lower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar12] = dVar3;
                  }
                  puVar1 = (local_98->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           (uVar12 >> 6);
                  *puVar1 = *puVar1 | 1L << ((byte)iVar6 & 0x3f);
                }
                bVar15 = false;
              }
              else {
                local_f0 = local_f0 + 1;
                bVar15 = false;
                if (local_f0 % local_100 == 0) {
                  highsLogUser(local_110,kWarning,
                               "Row name \"%s\" in RHS section has duplicate value %g: ignored\n",
                               local_d8._0_8_);
                  local_100 = local_100 * 2;
                }
              }
            }
          }
        }
        else {
          local_90._M_local_buf[0] = '\0';
          dVar3 = getValue(pHVar14,(string *)local_b8,(bool *)local_90._M_local_buf,id);
          local_68._8_4_ = extraout_XMM0_Dc;
          local_68._0_8_ = dVar3;
          local_68._12_4_ = extraout_XMM0_Dd;
          iVar8 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)local_e0,(key_type *)local_d8);
          iVar6 = *(int *)((long)iVar8.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                 ._M_cur + 0x28);
          uVar12 = (ulong)iVar6;
          if ((long)uVar12 < 0) {
            cVar16 = this->has_obj_entry_;
          }
          else {
            cVar16 = ((local_98->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar12 >> 6]
                      >> (uVar12 & 0x3f) & 1) != 0;
          }
          if (cVar16 == '\0') {
            if (local_90._M_local_buf[0] == '\x01') {
              local_118 = kFail;
              bVar4 = false;
              highsLogUser(local_110,kError,"RHS for row \"%s\" is NaN\n",local_d8._0_8_);
            }
            else {
              if (iVar6 < 0) {
                this->obj_offset = -(double)local_68._0_8_;
                this->has_obj_entry_ = true;
              }
              else {
                BVar2 = (this->row_type).
                        super__Vector_base<free_format_parser::HMpsFF::Boundtype,_std::allocator<free_format_parser::HMpsFF::Boundtype>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar12];
                if (BVar2 < kGe) {
                  (this->row_upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar12] = (double)local_68._0_8_;
                }
                if (BVar2 - kEq < 2) {
                  (this->row_lower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar12] = (double)local_68._0_8_;
                }
                puVar1 = (local_98->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                         (uVar12 >> 6);
                *puVar1 = *puVar1 | 1L << ((byte)iVar6 & 0x3f);
              }
              bVar4 = true;
            }
          }
          else {
            local_f0 = local_f0 + 1;
            bVar4 = true;
            if (local_f0 % local_100 == 0) {
              highsLogUser(local_110,kWarning,
                           "Row name \"%s\" in RHS section has duplicate value %g: ignored\n",
                           local_68._0_4_,local_d8._0_8_);
              local_100 = local_100 * 2;
            }
          }
          bVar15 = true;
          if (bVar4) goto LAB_001f97ba;
        }
      }
      if ((HMpsFF *)local_d8._0_8_ != (HMpsFF *)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_);
      }
    }
    else {
      if (PVar5 == kNone) {
        iVar8 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)local_e0,(key_type *)local_b8);
        if (iVar8.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
            ._M_cur != (__node_type *)0x0) {
          local_108 = local_70;
        }
        goto LAB_001f93b2;
      }
      this->warning_issued_ = local_e8 != 0 || local_f0 != 0;
      if (local_e8 != 0 || local_f0 != 0) {
        highsLogUser(local_110,kWarning,
                     "RHS section: ignored %d undefined rows and %d duplicate values\n",local_e8,
                     local_f0);
      }
      bVar15 = true;
      highsLogDev(local_110,kInfo,"readMPS: Read RHS     OK\n");
      local_118 = PVar5;
    }
    pHVar14 = (HMpsFF *)local_b8._0_8_;
    if ((HMpsFF *)local_b8._0_8_ != (HMpsFF *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_);
    }
    if (bVar15) {
LAB_001f9b10:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      return local_118;
    }
  }
  local_118 = kTimeout;
  goto LAB_001f9b10;
}

Assistant:

HMpsFF::Parsekey HMpsFF::parseRhs(const HighsLogOptions& log_options,
                                  std::istream& file) {
  std::string strline;

  auto parseName = [this](const std::string& name, HighsInt& rowidx,
                          bool& has_entry) {
    auto mit = rowname2idx.find(name);

    assert(mit != rowname2idx.end());
    rowidx = mit->second;

    assert(rowidx < num_row);

    if (rowidx > -1) {
      has_entry = has_row_entry_[rowidx];
    } else {
      assert(rowidx == -1);
      has_entry = has_obj_entry_;
    }
  };

  auto addRhs = [this](double val, HighsInt rowidx) {
    if (rowidx > -1) {
      if (row_type[rowidx] == Boundtype::kEq ||
          row_type[rowidx] == Boundtype::kLe) {
        assert(size_t(rowidx) < row_upper.size());
        row_upper[rowidx] = val;
      }
      if (row_type[rowidx] == Boundtype::kEq ||
          row_type[rowidx] == Boundtype::kGe) {
        assert(size_t(rowidx) < row_lower.size());
        row_lower[rowidx] = val;
      }
      has_row_entry_[rowidx] = true;
    } else {
      // objective shift
      assert(rowidx == -1);
      obj_offset = -val;
      has_obj_entry_ = true;
    }
  };

  // Initialise tracking for duplicate entries
  has_row_entry_.assign(num_row, false);
  has_obj_entry_ = false;
  bool has_entry = false;

  bool skip;
  size_t num_ignored_row_name = 0;
  size_t report_ignored_row_name_frequency = 1;
  size_t num_ignored_duplicate_rhs = 0;
  size_t report_ignored_duplicate_rhs_frequency = 1;
  while (getMpsLine(file, strline, skip)) {
    if (skip) continue;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    size_t begin = 0;
    size_t end = 0;
    std::string word;
    HMpsFF::Parsekey key = checkFirstWord(strline, begin, end, word);

    // start of new section?
    if (key != Parsekey::kNone && key != Parsekey::kRhs) {
      warning_issued_ =
          num_ignored_row_name > 0 || num_ignored_duplicate_rhs > 0;
      if (warning_issued_)
        highsLogUser(
            log_options, HighsLogType::kWarning,
            "RHS section: ignored %d undefined rows and %d duplicate values\n",
            int(num_ignored_row_name), int(num_ignored_duplicate_rhs));
      highsLogDev(log_options, HighsLogType::kInfo,
                  "readMPS: Read RHS     OK\n");
      return key;
    }

    // Ignore lack of name for SIF format;
    // we know we have this case when "word" is a row name
    if ((key == Parsekey::kNone) && (key != Parsekey::kRhs) &&
        (rowname2idx.find(word) != rowname2idx.end())) {
      end = begin;
    }

    HighsInt rowidx;

    std::string marker = first_word(strline, end);
    size_t end_marker = first_word_end(strline, end);

    // here marker is the row name and end marks its end
    word = "";
    word = first_word(strline, end_marker);
    end = first_word_end(strline, end_marker);

    if (word == "") {
      trim(marker);
      highsLogUser(log_options, HighsLogType::kError,
                   "No bound given for row \"%s\"\n", marker.c_str());
      return HMpsFF::Parsekey::kFail;
    }

    auto mit = rowname2idx.find(marker);

    // SIF format sometimes has the name of the MPS file
    // prepended to the RHS entry; remove it here if
    // that's the case. "word" will then hold the marker,
    // so also get new "word" and "end" values
    if (mit == rowname2idx.end()) {
      if (marker == mps_name) {
        marker = word;
        end_marker = end;
        word = "";
        word = first_word(strline, end_marker);
        end = first_word_end(strline, end_marker);
        if (word == "") {
          trim(marker);
          highsLogUser(log_options, HighsLogType::kError,
                       "No bound given for SIF row \"%s\"\n", marker.c_str());
          return HMpsFF::Parsekey::kFail;
        }
        mit = rowname2idx.find(marker);
      }
    }

    if (mit == rowname2idx.end()) {
      num_ignored_row_name++;
      if (num_ignored_row_name % report_ignored_row_name_frequency == 0) {
        highsLogUser(log_options, HighsLogType::kWarning,
                     "Row name \"%s\" in RHS section is not defined: ignored\n",
                     marker.c_str());
        report_ignored_row_name_frequency *= 2;
      }
    } else {
      bool is_nan = false;
      double value = getValue(word, is_nan);  // atof(word.c_str());
      parseName(marker, rowidx, has_entry);
      if (has_entry) {
        num_ignored_duplicate_rhs++;
        if (num_ignored_duplicate_rhs %
                report_ignored_duplicate_rhs_frequency ==
            0) {
          highsLogUser(log_options, HighsLogType::kWarning,
                       "Row name \"%s\" in RHS section has duplicate value %g: "
                       "ignored\n",
                       marker.c_str(), value);
          report_ignored_duplicate_rhs_frequency *= 2;
        }
      } else {
        if (is_nan) {
          highsLogUser(log_options, HighsLogType::kError,
                       "RHS for row \"%s\" is NaN\n", marker.c_str());
          return HMpsFF::Parsekey::kFail;
        }
        addRhs(value, rowidx);
      }
    }

    if (!is_end(strline, end)) {
      // parse second coefficient
      marker = first_word(strline, end);
      if (word == "") {
        trim(marker);
        highsLogUser(log_options, HighsLogType::kError,
                     "No coefficient given for rhs of row \"%s\"\n",
                     marker.c_str());
        return HMpsFF::Parsekey::kFail;
      }
      end_marker = first_word_end(strline, end);

      // here marker is the row name and end marks its end
      word = "";
      end_marker++;
      word = first_word(strline, end_marker);
      end = first_word_end(strline, end_marker);

      assert(is_end(strline, end));

      auto mit = rowname2idx.find(marker);
      if (mit == rowname2idx.end()) {
        num_ignored_row_name++;
        if (num_ignored_row_name % report_ignored_row_name_frequency == 0) {
          highsLogUser(
              log_options, HighsLogType::kWarning,
              "Row name \"%s\" in RHS section is not defined: ignored\n",
              marker.c_str());
          report_ignored_row_name_frequency *= 2;
        }
        continue;
      };

      parseName(marker, rowidx, has_entry);
      bool is_nan = false;
      double value = getValue(word, is_nan);  // atof(word.c_str());
      if (has_entry) {
        num_ignored_duplicate_rhs++;
        if (num_ignored_duplicate_rhs %
                report_ignored_duplicate_rhs_frequency ==
            0) {
          highsLogUser(log_options, HighsLogType::kWarning,
                       "Row name \"%s\" in RHS section has duplicate value %g: "
                       "ignored\n",
                       marker.c_str(), value);
          report_ignored_duplicate_rhs_frequency *= 2;
        }
      } else {
        if (is_nan) {
          highsLogUser(log_options, HighsLogType::kError,
                       "RHS for row \"%s\" is NaN\n", marker.c_str());
          return HMpsFF::Parsekey::kFail;
        }
        addRhs(value, rowidx);
      }
    }
  }

  return Parsekey::kFail;
}